

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionSystemBullet::ReportContacts
          (ChCollisionSystemBullet *this,ChContactContainer *mcontactcontainer)

{
  double dVar1;
  undefined1 auVar2 [16];
  cbtCollisionObject *pcVar3;
  cbtCollisionObject *pcVar4;
  element_type *peVar5;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar24 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar25 [64];
  undefined1 extraout_var_01 [56];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 in_XMM9_Qb;
  double local_118;
  uint local_f8;
  double dStack_f0;
  undefined1 local_c8 [48];
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  undefined1 local_78 [16];
  double local_68;
  double local_60;
  float *local_50;
  undefined1 local_48 [24];
  cbtPersistentManifold *this_00;
  double dVar23;
  
  (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(mcontactcontainer);
  ChCollisionInfo::ChCollisionInfo((ChCollisionInfo *)local_c8);
  iVar13 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[9])();
  if (0 < iVar13) {
    iVar19 = 0;
    do {
      iVar14 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[10])();
      this_00 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar14);
      pcVar3 = this_00->m_body0;
      pcVar4 = this_00->m_body1;
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar3->m_worldTransform,&pcVar4->m_worldTransform);
      local_c8._0_8_ = pcVar3->m_userObjectPointer;
      local_c8._8_8_ = pcVar4->m_userObjectPointer;
      (*((ChCollisionModel *)local_c8._0_8_)->_vptr_ChCollisionModel[0x25])();
      auVar24 = in_ZMM0._0_16_;
      (*(*(_func_int ***)local_c8._8_8_)[0x25])();
      auVar25 = in_ZMM0;
      (*(*(_func_int ***)local_c8._0_8_)[0x23])();
      fVar22 = auVar25._0_4_;
      (*(*(_func_int ***)local_c8._8_8_)[0x23])();
      peVar5 = (this->super_ChCollisionSystem).broad_callback.
               super___shared_ptr<chrono::collision::ChCollisionSystem::BroadphaseCallback,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      fVar26 = auVar25._0_4_;
      if (peVar5 == (element_type *)0x0) {
LAB_007f0df6:
        iVar14 = this_00->m_cachedPoints;
        if (0 < (long)iVar14) {
          lVar17 = 0;
          local_f8 = in_ZMM0._0_4_;
          auVar24 = vinsertps_avx(auVar24,ZEXT416(local_f8),0x10);
          auVar24 = vcvtps2pd_avx(auVar24);
          auVar10 = vshufpd_avx(auVar24,auVar24,1);
          dVar29 = auVar24._0_8_;
          local_48._0_16_ = vshufpd_avx(auVar24,auVar24,3);
          do {
            dVar23 = (double)*(float *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 1) +
                                       lVar17);
            auVar25 = ZEXT1664(CONCAT88(in_XMM9_Qb,dVar23));
            if (dVar23 < (double)fVar22 + (double)fVar26) {
              iVar18 = 0;
              dStack_f0 = auVar24._8_8_;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)((long)this_00->m_pointCache[0].m_positionWorldOnB.m_floats +
                                       lVar17 + 4);
              auVar2 = vcvtps2pd_avx(auVar2);
              local_50 = (float *)((long)this_00->m_pointCache[0].reactions_cache + lVar17);
              auVar20._0_8_ =
                   *(ulong *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats + lVar17) ^
                   0x8000000080000000;
              auVar20._8_4_ = 0x80000000;
              auVar20._12_4_ = 0x80000000;
              auVar27._0_4_ =
                   -*(float *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats + lVar17 + 8
                              );
              auVar27._4_4_ = 0x80000000;
              auVar27._8_4_ = 0x80000000;
              auVar27._12_4_ = 0x80000000;
              auVar20 = vcvtps2pd_avx(auVar20);
              auVar28._0_8_ = (double)auVar27._0_4_;
              auVar28._8_8_ = auVar27._8_8_;
              auVar33._0_8_ = auVar20._0_8_ * auVar20._0_8_;
              auVar33._8_8_ = auVar20._8_8_ * auVar20._8_8_;
              auVar11 = vshufpd_avx(auVar33,auVar33,1);
              auVar11 = vfmadd231sd_fma(auVar11,auVar20,auVar20);
              auVar11 = vfmadd231sd_fma(auVar11,auVar28,auVar28);
              auVar11 = vsqrtsd_avx(auVar11,auVar11);
              dVar31 = auVar11._0_8_;
              dVar32 = 1.0 / dVar31;
              auVar11._8_8_ = 0;
              auVar11._0_8_ =
                   *(ulong *)((long)this_00->m_pointCache[0].m_positionWorldOnA.m_floats + lVar17);
              auVar11 = vcvtps2pd_avx(auVar11);
              uVar16 = 0;
              if (2.2250738585072014e-308 <= dVar31) {
                uVar16 = 0xff;
              }
              auVar34._8_8_ = dVar32;
              auVar34._0_8_ = dVar32;
              auVar20 = vmulpd_avx512vl(auVar34,auVar20);
              bVar9 = (bool)((byte)uVar16 & 1);
              local_78._0_8_ =
                   (double)((ulong)bVar9 * auVar20._0_8_ | (ulong)!bVar9 * 0x3ff0000000000000);
              dVar1 = (double)((ulong)((byte)(uVar16 >> 1) & 1) * auVar20._8_8_);
              local_78._8_8_ = dVar1;
              auVar30._0_8_ = local_78._0_8_ * dVar29;
              auVar30._8_8_ = dVar1 * dVar29;
              local_68 = (double)((ulong)(2.2250738585072014e-308 <= dVar31) *
                                 (long)(dVar32 * auVar28._0_8_));
              auVar21._8_8_ = 0;
              auVar21._0_8_ = local_68;
              local_118 = auVar10._0_8_;
              local_60 = dVar29 + dVar23 + local_118;
              auVar25 = ZEXT864((ulong)local_60);
              auVar20 = vunpcklpd_avx(auVar21,local_78);
              auVar35._0_8_ = auVar20._0_8_ * dVar29;
              auVar35._8_8_ = auVar20._8_8_ * dStack_f0;
              local_c8._32_16_ = vsubpd_avx(auVar11,auVar30);
              auVar11 = vinsertps_avx(ZEXT416(*(uint *)((long)this_00->m_pointCache[0].
                                                              m_positionWorldOnA.m_floats +
                                                       lVar17 + 8)),
                                      ZEXT416(*(uint *)((long)this_00->m_pointCache[0].
                                                              m_positionWorldOnB.m_floats + lVar17))
                                      ,0x10);
              auVar20 = vshufpd_avx(local_78,auVar21,1);
              auVar11 = vcvtps2pd_avx(auVar11);
              local_88 = auVar20._0_8_ * (double)local_48._0_8_ + auVar2._0_8_;
              dStack_80 = auVar20._8_8_ * (double)local_48._8_8_ + auVar2._8_8_;
              local_98 = vaddsubpd_avx(auVar11,auVar35);
              iVar15 = 0;
              if (pcVar3->m_collisionShape->m_shapeType == 0x25) {
                iVar15 = *(int *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 2) +
                                 lVar17 + 0xc);
              }
              if (pcVar4->m_collisionShape->m_shapeType == 0x25) {
                iVar18 = *(int *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 3) + lVar17);
              }
              psVar6 = (((vector<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                          *)(local_c8._0_8_ + 0x20))->
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_c8._16_8_ =
                   psVar6[iVar15].
                   super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              p_Var7 = psVar6[iVar15].
                       super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                }
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              psVar6 = (((vector<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                          *)(local_c8._8_8_ + 0x20))->
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_c8._24_8_ =
                   psVar6[iVar18].
                   super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              p_Var7 = psVar6[iVar18].
                       super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                }
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              peVar8 = (this->super_ChCollisionSystem).narrow_callback.
                       super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (peVar8 != (element_type *)0x0) {
                cVar12 = (**(code **)(*(long *)peVar8 + 0x10))(peVar8,local_c8);
                auVar25._8_56_ = extraout_var_01;
                auVar25._0_8_ = extraout_XMM0_Qa_00;
                if (cVar12 == '\0') goto LAB_007f109d;
              }
              (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x40])
                        (mcontactcontainer,local_c8);
            }
LAB_007f109d:
            lVar17 = lVar17 + 0xe0;
          } while ((long)iVar14 * 0xe0 - lVar17 != 0);
        }
      }
      else {
        cVar12 = (**(code **)(*(long *)peVar5 + 0x10))(peVar5,local_c8._0_8_,local_c8._8_8_);
        auVar25._8_56_ = extraout_var_00;
        auVar25._0_8_ = extraout_XMM0_Qa;
        if (cVar12 != '\0') goto LAB_007f0df6;
      }
      iVar19 = iVar19 + 1;
      in_ZMM0 = auVar25;
    } while (iVar19 != iVar13);
  }
  (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x41])();
  return;
}

Assistant:

void ChCollisionSystemBullet::ReportContacts(ChContactContainer* mcontactcontainer) {
    // This should remove all old contacts (or at least rewind the index)
    mcontactcontainer->BeginAddContact();

    // NOTE: Bullet does not provide information on radius of curvature at a contact point.
    // As such, for all Bullet-identified contacts, the default value will be used (SMC only).
    ChCollisionInfo icontact;

    int numManifolds = bt_collision_world->getDispatcher()->getNumManifolds();
    for (int i = 0; i < numManifolds; i++) {
        cbtPersistentManifold* contactManifold = bt_collision_world->getDispatcher()->getManifoldByIndexInternal(i);
        const cbtCollisionObject* obA = contactManifold->getBody0();
        const cbtCollisionObject* obB = contactManifold->getBody1();
        contactManifold->refreshContactPoints(obA->getWorldTransform(), obB->getWorldTransform());

        icontact.modelA = (ChCollisionModel*)obA->getUserPointer();
        icontact.modelB = (ChCollisionModel*)obB->getUserPointer();

        double envelopeA = icontact.modelA->GetEnvelope();
        double envelopeB = icontact.modelB->GetEnvelope();

        double marginA = icontact.modelA->GetSafeMargin();
        double marginB = icontact.modelB->GetSafeMargin();

        // Execute custom broadphase callback, if any
        bool do_narrow_contactgeneration = true;
        if (this->broad_callback)
            do_narrow_contactgeneration = this->broad_callback->OnBroadphase(icontact.modelA, icontact.modelB);

        if (do_narrow_contactgeneration) {
            int numContacts = contactManifold->getNumContacts();
            // GetLog() << "numContacts=" << numContacts << "\n";
            for (int j = 0; j < numContacts; j++) {
                cbtManifoldPoint& pt = contactManifold->getContactPoint(j);

                // Discard "too far" constraints (the Bullet engine also has its threshold)
                if (pt.getDistance() < marginA + marginB) {
                    cbtVector3 ptA = pt.getPositionWorldOnA();
                    cbtVector3 ptB = pt.getPositionWorldOnB();

                    icontact.vpA.Set(ptA.getX(), ptA.getY(), ptA.getZ());
                    icontact.vpB.Set(ptB.getX(), ptB.getY(), ptB.getZ());

                    icontact.vN.Set(-pt.m_normalWorldOnB.getX(), -pt.m_normalWorldOnB.getY(),
                                    -pt.m_normalWorldOnB.getZ());
                    icontact.vN.Normalize();

                    double ptdist = pt.getDistance();

                    icontact.vpA = icontact.vpA - icontact.vN * envelopeA;
                    icontact.vpB = icontact.vpB + icontact.vN * envelopeB;
                    icontact.distance = ptdist + envelopeA + envelopeB;

                    icontact.reaction_cache = pt.reactions_cache;

                    bool compoundA = (obA->getCollisionShape()->getShapeType() == COMPOUND_SHAPE_PROXYTYPE);
                    bool compoundB = (obB->getCollisionShape()->getShapeType() == COMPOUND_SHAPE_PROXYTYPE);

                    int indexA = compoundA ? pt.m_index0 : 0;
                    int indexB = compoundB ? pt.m_index1 : 0;

                    icontact.shapeA = icontact.modelA->GetShape(indexA).get();
                    icontact.shapeB = icontact.modelB->GetShape(indexB).get();

                    // Execute some user custom callback, if any
                    bool add_contact = true;
                    if (this->narrow_callback)
                        add_contact = this->narrow_callback->OnNarrowphase(icontact);

                    // Add to contact container
                    if (add_contact) {
                        ////std::cout << " add indexA=" << indexA << " indexB=" << indexB << std::endl;
                        ////std::cout << "     typeA=" << icontact.shapeA->m_type << " typeB=" << icontact.shapeB->m_type << std::endl;

                        mcontactcontainer->AddContact(icontact);
                    }
                }
            }
        }

        // Uncomment this line to remove all points
        ////contactManifold->clearManifold();
    }
    mcontactcontainer->EndAddContact();
}